

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteResult::execBatch(QSQLiteResult *this,bool arrayBind)

{
  bool bVar1;
  qsizetype qVar2;
  QHash<QString,_QList<int>_> *this_00;
  const_iterator *this_01;
  ulong uVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  QSqlResultPrivate *d;
  const_iterator it;
  QScopedValueRollback<QHash<QString,_QList<int>_>_> indexesScope;
  QList<QVariant> values;
  QScopedValueRollback<QList<QVariant>_> valuesScope;
  undefined4 in_stack_ffffffffffffff08;
  ParamTypeFlag in_stack_ffffffffffffff0c;
  QScopedValueRollback<QList<QVariant>_> *in_stack_ffffffffffffff10;
  const_reference in_stack_ffffffffffffff18;
  int local_c8;
  byte local_a5;
  undefined4 local_a4;
  QList<QVariant> local_58;
  QList<QVariant> local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QSQLiteResult *)0x1159e9);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QScopedValueRollback<QList<QVariant>_>::QScopedValueRollback
            (in_stack_ffffffffffffff10,
             (QList<QVariant> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QVariant>::QList
            ((QList<QVariant> *)in_stack_ffffffffffffff10,
             (QList<QVariant> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  qVar2 = QList<QVariant>::size(&local_40);
  if (qVar2 == 0) {
    local_a5 = 0;
  }
  else {
    local_c8 = 0;
    while( true ) {
      this_00 = (QHash<QString,_QList<int>_> *)(long)local_c8;
      QList<QVariant>::at((QList<QVariant> *)in_stack_ffffffffffffff10,
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      QVariant::toList();
      this_01 = (const_iterator *)QList<QVariant>::size(&local_58);
      QList<QVariant>::~QList((QList<QVariant> *)0x115afa);
      if ((long)this_01 <= (long)this_00) break;
      QList<QVariant>::clear((QList<QVariant> *)in_stack_ffffffffffffff10);
      QScopedValueRollback<QHash<QString,_QList<int>_>_>::QScopedValueRollback
                ((QScopedValueRollback<QHash<QString,_QList<int>_>_> *)in_stack_ffffffffffffff10,
                 (QHash<QString,_QList<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      QHash<QString,_QList<int>_>::constBegin(this_00);
      while( true ) {
        QHash<QString,_QList<int>_>::constEnd
                  ((QHash<QString,_QList<int>_> *)in_stack_ffffffffffffff18);
        bVar1 = QHash<QString,_QList<int>_>::const_iterator::operator!=
                          ((const_iterator *)in_stack_ffffffffffffff18,
                           (const_iterator *)in_stack_ffffffffffffff10);
        if (!bVar1) break;
        in_stack_ffffffffffffff10 =
             (QScopedValueRollback<QList<QVariant>_> *)
             QHash<QString,_QList<int>_>::const_iterator::key((const_iterator *)0x115bcb);
        QHash<QString,_QList<int>_>::const_iterator::value((const_iterator *)0x115bdd);
        QList<int>::first((QList<int> *)in_stack_ffffffffffffff10);
        QList<QVariant>::at((QList<QVariant> *)in_stack_ffffffffffffff10,
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        QVariant::toList();
        in_stack_ffffffffffffff18 =
             QList<QVariant>::at((QList<QVariant> *)in_stack_ffffffffffffff10,
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        QFlags<QSql::ParamTypeFlag>::QFlags
                  ((QFlags<QSql::ParamTypeFlag> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff0c);
        (**(code **)(*in_RDI + 0x68))
                  (in_RDI,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,local_a4);
        QList<QVariant>::~QList((QList<QVariant> *)0x115c48);
        QHash<QString,_QList<int>_>::const_iterator::operator++(this_01);
      }
      uVar3 = (**(code **)(*in_RDI + 0x48))();
      bVar1 = (uVar3 & 1) == 0;
      if (bVar1) {
        local_a5 = 0;
      }
      QScopedValueRollback<QHash<QString,_QList<int>_>_>::~QScopedValueRollback
                ((QScopedValueRollback<QHash<QString,_QList<int>_>_> *)in_stack_ffffffffffffff10);
      if (bVar1) goto LAB_00115cb6;
      local_c8 = local_c8 + 1;
    }
    local_a5 = 1;
  }
LAB_00115cb6:
  QList<QVariant>::~QList((QList<QVariant> *)0x115cc3);
  QScopedValueRollback<QList<QVariant>_>::~QScopedValueRollback(in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_a5 & 1);
}

Assistant:

bool QSQLiteResult::execBatch(bool arrayBind)
{
    Q_UNUSED(arrayBind);
    Q_D(QSqlResult);
    QScopedValueRollback<QList<QVariant>> valuesScope(d->values);
    QList<QVariant> values = d->values;
    if (values.size() == 0)
        return false;

    for (int i = 0; i < values.at(0).toList().size(); ++i) {
        d->values.clear();
        QScopedValueRollback<QHash<QString, QList<int>>> indexesScope(d->indexes);
        auto it = d->indexes.constBegin();
        while (it != d->indexes.constEnd()) {
            bindValue(it.key(), values.at(it.value().first()).toList().at(i), QSql::In);
            ++it;
        }
        if (!exec())
            return false;
    }
    return true;
}